

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void proxy_http_process_queue(ProxyNegotiator *pn)

{
  ptrlen *ppVar1;
  BinarySink *s;
  HttpAuthType HVar2;
  ProxyNegotiatorVT *pPVar3;
  bufchain *pbVar4;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var5;
  IdempotentCallback *pIVar6;
  HttpAuthDetails *d;
  BinarySink *pBVar7;
  BinarySink *pBVar8;
  ptrlen pl;
  ptrlen pl1;
  ptrlen password;
  SeatPromptResult spr_00;
  ptrlen method;
  ptrlen qop;
  ptrlen opaque;
  ptrlen pVar9;
  ptrlen pVar10;
  _Bool _Var11;
  int iVar12;
  int iVar13;
  uint uVar14;
  InteractionReadySeat IVar15;
  char *pcVar16;
  size_t sVar17;
  strbuf *psVar18;
  HttpAuthDetails *pHVar19;
  uintmax_t uVar20;
  BinarySink *pBVar21;
  BinarySink *pBVar22;
  prompts_t *ppVar23;
  undefined4 uVar24;
  InteractorVtable *pIVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  uint32_t nonce_count;
  char cVar30;
  char cVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  ptrlen pl_00;
  ptrlen pl_01;
  ptrlen pVar35;
  ptrlen pVar36;
  ptrlen pl_02;
  ptrlen pl_03;
  ptrlen pl_04;
  ptrlen pl_05;
  char c;
  char buf [2];
  int min_ver;
  SeatPromptResult spr;
  int maj_ver;
  char local_2c3;
  short local_2c2;
  int local_2c0;
  int local_2bc;
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  char *local_2a8;
  undefined8 uStack_2a0;
  char *local_298;
  undefined8 uStack_290;
  void *local_288;
  undefined8 uStack_280;
  void *local_278;
  undefined8 uStack_270;
  void *local_268;
  undefined8 uStack_260;
  SeatPromptResult local_258;
  int local_238 [130];
  
  s = pn[-2].output[0].binarysink_;
  iVar13 = *(int *)&pn[-2].output[0].binarysink_[0].write;
  uVar24 = 0;
  if (0x263 < iVar13) {
    if (iVar13 < 0x289) {
      if (iVar13 == 0x264) goto LAB_00144bc7;
      if (iVar13 == 0x271) goto LAB_00145024;
    }
    else {
      if (iVar13 == 0x289) goto LAB_00145081;
      if (iVar13 == 0x28f) {
        while( true ) {
          _Var11 = bufchain_try_fetch_consume(pn->input,&local_2c2,2);
          if (!_Var11) {
            return;
          }
          if (local_2c2 != 0xa0d) break;
          if (pn[-1].error == (char *)0x0) goto LAB_001450da;
LAB_00145011:
          pn[-1].error = (char *)0x0;
          while( true ) {
            *(undefined4 *)&s->write = 0x271;
LAB_00145024:
            _Var11 = bufchain_try_fetch_consume(pn->input,&local_2c3,1);
            if (!_Var11) {
              return;
            }
            iVar13 = (int)local_2c3;
            if (iVar13 == 10) break;
            if (local_2c3 != '\r') {
              if ((byte)(local_2c3 - 0x30U) < 10) {
                pcVar16 = (char *)((ulong)(iVar13 - 0x30) | (long)pn[-1].error << 4);
              }
              else {
                if ((byte)(local_2c3 + 0xbfU) < 6) {
                  pcVar16 = pn[-1].error;
                  uVar14 = iVar13 - 0x37;
                }
                else {
                  if (5 < (byte)(local_2c3 + 0x9fU)) {
                    pcVar16 = dupprintf(
                                       "Received bad character 0x%02X in chunk length during HTTP chunked transfer encoding"
                                       );
                    goto LAB_00145189;
                  }
                  pcVar16 = pn[-1].error;
                  uVar14 = iVar13 - 0x57;
                }
                pcVar16 = (char *)((ulong)uVar14 + (long)pcVar16 * 0x10);
              }
              pn[-1].error = pcVar16;
            }
          }
          *(undefined4 *)&s->write = 0x289;
LAB_00145081:
          _Var11 = bufchain_try_consume(pn->input,(size_t)pn[-1].error);
          if (!_Var11) {
            return;
          }
          *(undefined4 *)&s->write = 0x28f;
        }
        pcVar16 = "Missing CRLF after chunk during HTTP chunked transfer encoding";
LAB_00145164:
        pcVar16 = dupprintf(pcVar16);
LAB_00145189:
        uVar24 = 0;
        pn->error = pcVar16;
        goto LAB_0014518f;
      }
      if (iVar13 != 0x2e6) goto LAB_0014500a;
LAB_00144371:
      IVar15 = interactor_announce(pn->itr);
      (*(IVar15.seat)->vt->get_userpass_input)
                (&local_258,IVar15.seat,(prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_);
      if (local_258.kind == SPRK_OK) {
        if (*(int *)&pn[-1].itr != -1) {
          strbuf_shrink_to(*(strbuf **)&pn[-2].aborted,0);
          lVar27 = *(long *)&pn[-2].aborted;
          pcVar16 = prompt_get_result_ref
                              (*(prompt_t **)
                                (pn[-1].output[0].binarysink_[0].binarysink_[2].writefmtv +
                                (long)*(int *)&pn[-1].itr * 8));
          sVar17 = strlen(pcVar16);
          pl_00.len = sVar17;
          pl_00.ptr = pcVar16;
          BinarySink_put_datapl((BinarySink *)(lVar27 + 0x18),pl_00);
        }
        strbuf_shrink_to((strbuf *)pn[-1].vt,0);
        pPVar3 = pn[-1].vt;
        pcVar16 = prompt_get_result_ref
                            (*(prompt_t **)
                              (pn[-1].output[0].binarysink_[0].binarysink_[2].writefmtv +
                              (long)*(int *)((long)&pn[-1].itr + 4) * 8));
        sVar17 = strlen(pcVar16);
        pl_01.len = sVar17;
        pl_01.ptr = pcVar16;
        BinarySink_put_datapl((BinarySink *)&pPVar3->type,pl_01);
        free_prompts((prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_);
        pn[-1].output[0].binarysink_[0].binarysink_ = (BinarySink *)0x0;
        goto LAB_001445fe;
      }
      uVar24 = 0x2e6;
      if (1 < local_258.kind - SPRK_USER_ABORT) goto LAB_0014518f;
      spr_00._4_4_ = local_258._4_4_;
      spr_00.kind = local_258.kind;
      spr_00.errfn = local_258.errfn;
      spr_00.errdata_lit = local_258.errdata_lit;
      spr_00.errdata_u = local_258.errdata_u;
      spr_00._28_4_ = local_258._28_4_;
      proxy_spr_abort(pn,spr_00);
    }
LAB_0014500a:
    uVar24 = 0;
    goto LAB_0014518f;
  }
  if (iVar13 < 0x1da) {
    if (iVar13 != 0) {
      if (iVar13 != 0x1cf) goto LAB_0014518f;
      *(undefined8 *)&pn[-1].done = 0;
      pn[-1].aborted = false;
      *(undefined1 *)((long)&pn[-1].ps + 4) = 0;
      strbuf_shrink_to((strbuf *)pn[-2].output[0].binarysink_[0].writefmtv,0);
      *(undefined4 *)&pn[-2].output[0].binarysink_[0].write = 0x1da;
      goto LAB_001444b6;
    }
    lVar27 = *(long *)&pn[-2].aborted;
    pcVar16 = conf_get_str(pn->ps->conf,0x10);
    sVar17 = strlen(pcVar16);
    pVar35.len = sVar17;
    pVar35.ptr = pcVar16;
    BinarySink_put_datapl((BinarySink *)(lVar27 + 0x18),pVar35);
    pPVar3 = pn[-1].vt;
    pcVar16 = conf_get_str(pn->ps->conf,0x11);
    sVar17 = strlen(pcVar16);
    pVar36.len = sVar17;
    pVar36.ptr = pcVar16;
    BinarySink_put_datapl((BinarySink *)&pPVar3->type,pVar36);
    if ((*(long *)(*(long *)&pn[-2].aborted + 0x10) != 0) ||
       ((pn[-1].vt)->free != (_func_void_ProxyNegotiator_ptr *)0x0)) {
      *(undefined1 *)&pn[-1].output[0].ch = 1;
    }
    sk_getaddr(pn->ps->remote_addr,(char *)local_238,0x200);
    BinarySink_put_fmt((BinarySink *)(pn[-1].output[0].binarysink_[0].write + 0x18),"%s:%d",
                       local_238,(ulong)(uint)pn->ps->remote_port);
  }
  else {
    if (iVar13 != 0x1da) {
      if (iVar13 == 0x1ff) goto LAB_0014490f;
      goto LAB_0014500a;
    }
LAB_001444b6:
    _Var11 = read_line(pn->input,(strbuf *)pn[-2].output[0].binarysink_[0].writefmtv,false);
    if (!_Var11) {
      return;
    }
    iVar13 = __isoc99_sscanf(*(undefined8 *)pn[-2].output[0].binarysink_[0].writefmtv,
                             "HTTP/%d.%d %n%d",local_238,&local_2bc,&pn[-2].done,&pn[-1].ps);
    if (iVar13 < 3) {
      pcVar16 = dupstr("HTTP response was absent or malformed");
      pn->error = pcVar16;
      *(undefined4 *)&pn[-2].output[0].binarysink_[0].write = 0;
    }
    else if ((local_238[0] < 1) || ((local_238[0] == 1 && (local_2bc < 1)))) {
      *(undefined1 *)((long)&pn[-1].ps + 4) = 1;
    }
    if (iVar13 < 3) {
      return;
    }
    if (*(int *)&pn[-1].ps == 0x197) {
      http_auth_details_free((HttpAuthDetails *)pn[-1].input);
      pHVar19 = http_auth_details_new();
      pn[-1].input = (bufchain *)pHVar19;
      auth_error(pHVar19,
                 "no Proxy-Authorization header seen in HTTP 407 Proxy Authentication Required response"
                );
    }
    do {
      strbuf_shrink_to((strbuf *)pn[-2].output[0].binarysink_[0].binarysink_,0);
      *(undefined4 *)&pn[-2].output[0].binarysink_[0].write = 0x1ff;
LAB_0014490f:
      _Var11 = read_line(pn->input,(strbuf *)pn[-2].output[0].binarysink_[0].binarysink_,true);
      if (!_Var11) {
        return;
      }
      pn[-2].error = (char *)0x0;
      _Var11 = get_token((HttpProxyNegotiator *)s);
      if (_Var11) {
        pIVar25 = (pn[-2].itr)->vt;
        iVar13 = strcasecmp((char *)pIVar25,"Connection");
        iVar12 = strcasecmp((char *)pIVar25,"Content-Length");
        cVar30 = '\x01';
        if (iVar12 != 0) {
          cVar30 = (iVar13 != 0) * '\x05';
        }
        iVar13 = strcasecmp((char *)pIVar25,"Transfer-Encoding");
        cVar31 = '\x02';
        if (iVar13 != 0) {
          cVar31 = cVar30;
        }
        local_2c0 = strcasecmp((char *)pIVar25,"Proxy-Authenticate");
        cVar30 = '\x03';
        if (local_2c0 != 0) {
          cVar30 = cVar31;
        }
        iVar13 = strcasecmp((char *)pIVar25,"Proxy-Connection");
        cVar31 = '\x04';
        if (iVar13 != 0) {
          cVar31 = cVar30;
        }
        _Var11 = get_separator((HttpProxyNegotiator *)s,':');
        if (_Var11) {
          if (cVar31 == '\x01') {
            _Var11 = get_token((HttpProxyNegotiator *)s);
            if (_Var11) {
              uVar20 = strtoumax((char *)(pn[-2].itr)->vt,(char **)0x0,10);
              *(uintmax_t *)&pn[-1].done = uVar20;
            }
          }
          else if (cVar31 == '\x02') {
            _Var11 = get_token((HttpProxyNegotiator *)s);
            if (_Var11) {
              do {
                iVar13 = strcasecmp((char *)(pn[-2].itr)->vt,"chunked");
                if (iVar13 == 0) {
                  pn[-1].aborted = true;
                }
                _Var11 = get_token((HttpProxyNegotiator *)s);
              } while (_Var11);
            }
          }
          else if ((iVar13 == 0) || (cVar31 == '\0')) {
            _Var11 = get_token((HttpProxyNegotiator *)s);
            if (_Var11) {
              pIVar25 = (pn[-2].itr)->vt;
              iVar13 = strcasecmp((char *)pIVar25,"close");
              if (iVar13 == 0) {
                *(undefined1 *)((long)&pn[-1].ps + 4) = 1;
              }
              else {
                iVar13 = strcasecmp((char *)pIVar25,"keep-alive");
                if (iVar13 == 0) {
                  *(undefined1 *)((long)&pn[-1].ps + 4) = 0;
                }
              }
            }
          }
          else if (local_2c0 == 0) {
            pHVar19 = http_auth_details_new();
            pHVar19->digest_hash = HTTP_DIGEST_MD5;
            _Var11 = get_token((HttpProxyNegotiator *)s);
            if (_Var11) {
              pIVar25 = (pn[-2].itr)->vt;
              iVar13 = strcasecmp((char *)pIVar25,"Basic");
              if (iVar13 == 0) {
                pHVar19->auth_type = AUTH_BASIC;
              }
              else {
                iVar13 = strcasecmp((char *)pIVar25,"Digest");
                if (iVar13 == 0) {
                  while (_Var11 = get_token((HttpProxyNegotiator *)s), _Var11) {
                    pIVar25 = (pn[-2].itr)->vt;
                    iVar13 = strcasecmp((char *)pIVar25,"realm");
                    if (iVar13 == 0) {
                      _Var11 = get_separator((HttpProxyNegotiator *)s,'=');
                      if ((!_Var11) ||
                         (_Var11 = get_quoted_string((HttpProxyNegotiator *)s), !_Var11)) {
                        pcVar16 = "parse error in Digest realm field";
                        goto LAB_00144b45;
                      }
                      psVar18 = pHVar19->realm;
LAB_00144d52:
                      pVar9.ptr = (pn[-2].itr)->parent;
                      pVar9.len = (size_t)(pn[-2].itr)->last_to_talk;
                      BinarySink_put_datapl(psVar18->binarysink_,pVar9);
                    }
                    else {
                      iVar13 = strcasecmp((char *)pIVar25,"nonce");
                      if (iVar13 == 0) {
                        _Var11 = get_separator((HttpProxyNegotiator *)s,'=');
                        if ((_Var11) &&
                           (_Var11 = get_quoted_string((HttpProxyNegotiator *)s), _Var11)) {
                          psVar18 = pHVar19->nonce;
                          goto LAB_00144d52;
                        }
                        pcVar16 = "parse error in Digest nonce field";
                        goto LAB_00144b45;
                      }
                      iVar13 = strcasecmp((char *)pIVar25,"opaque");
                      if (iVar13 == 0) {
                        _Var11 = get_separator((HttpProxyNegotiator *)s,'=');
                        if ((!_Var11) ||
                           (_Var11 = get_quoted_string((HttpProxyNegotiator *)s), !_Var11)) {
                          pcVar16 = "parse error in Digest opaque field";
                          goto LAB_00144b45;
                        }
                        pVar10.ptr = (pn[-2].itr)->parent;
                        pVar10.len = (size_t)(pn[-2].itr)->last_to_talk;
                        BinarySink_put_datapl(pHVar19->opaque->binarysink_,pVar10);
                        pHVar19->got_opaque = true;
                      }
                      else {
                        iVar13 = strcasecmp((char *)pIVar25,"stale");
                        if (iVar13 == 0) {
                          _Var11 = get_separator((HttpProxyNegotiator *)s,'=');
                          if ((!_Var11) || (_Var11 = get_token((HttpProxyNegotiator *)s), !_Var11))
                          {
                            pcVar16 = "parse error in Digest stale field";
                            goto LAB_00144b45;
                          }
                          iVar13 = strcasecmp((char *)(pn[-2].itr)->vt,"true");
                          pHVar19->digest_nonce_was_stale = iVar13 == 0;
                        }
                        else {
                          iVar13 = strcasecmp((char *)pIVar25,"userhash");
                          if (iVar13 == 0) {
                            _Var11 = get_separator((HttpProxyNegotiator *)s,'=');
                            if ((!_Var11) || (_Var11 = get_token((HttpProxyNegotiator *)s), !_Var11)
                               ) {
                              pcVar16 = "parse error in Digest userhash field";
                              goto LAB_00144b45;
                            }
                            iVar13 = strcasecmp((char *)(pn[-2].itr)->vt,"true");
                            pHVar19->hash_username = iVar13 == 0;
                          }
                          else {
                            iVar13 = strcasecmp((char *)pIVar25,"algorithm");
                            if (iVar13 == 0) {
                              _Var11 = get_separator((HttpProxyNegotiator *)s,'=');
                              if ((!_Var11) ||
                                 ((_Var11 = get_token((HttpProxyNegotiator *)s), !_Var11 &&
                                  (_Var11 = get_quoted_string((HttpProxyNegotiator *)s), !_Var11))))
                              {
                                pcVar16 = "parse error in Digest algorithm field";
                                goto LAB_00144b45;
                              }
                              pIVar25 = (pn[-2].itr)->vt;
                              lVar27 = 0;
                              do {
                                iVar13 = strcasecmp((char *)pIVar25,httphashnames[lVar27]);
                                if (iVar13 == 0) {
                                  if (httphashaccepted[lVar27] == false) {
                                    pcVar16 = "Digest hash algorithm \'%s\' not supported";
                                    goto LAB_00144f64;
                                  }
                                  pHVar19->digest_hash = (HttpDigestHash)lVar27;
                                  bVar33 = true;
                                  goto LAB_00144f6e;
                                }
                                lVar27 = lVar27 + 1;
                              } while (lVar27 != 3);
                              pcVar16 = "Digest hash algorithm \'%s\' not recognised";
LAB_00144f64:
                              bVar33 = false;
                              auth_error(pHVar19,pcVar16,pIVar25);
LAB_00144f6e:
                              if (!bVar33) goto LAB_00144b58;
                            }
                            else {
                              iVar13 = strcasecmp((char *)pIVar25,"qop");
                              _Var11 = get_separator((HttpProxyNegotiator *)s,'=');
                              if (iVar13 == 0) {
                                if ((!_Var11) ||
                                   (_Var11 = get_quoted_string((HttpProxyNegotiator *)s), !_Var11))
                                {
                                  pcVar16 = "parse error in Digest qop field";
                                  goto LAB_00144b45;
                                }
                                pIVar25 = (pn[-2].itr)->vt;
                                iVar13 = strcasecmp((char *)pIVar25,"auth");
                                if (iVar13 != 0) {
                                  pcVar16 = "quality-of-protection type \'%s\' not supported";
                                  goto LAB_00144ae8;
                                }
                              }
                              else if ((!_Var11) ||
                                      ((_Var11 = get_quoted_string((HttpProxyNegotiator *)s),
                                       !_Var11 &&
                                       (_Var11 = get_token((HttpProxyNegotiator *)s), !_Var11))))
                              break;
                            }
                          }
                        }
                      }
                    }
                    pBVar7 = pn[-2].output[0].binarysink_[0].binarysink_;
                    pBVar21 = (BinarySink *)pn[-2].error;
                    pBVar8 = pBVar7->binarysink_;
                    pBVar22 = pBVar21;
                    if (pBVar21 < pBVar8) {
                      do {
                        uVar29 = (ulong)*(byte *)((long)&pBVar21->write + (long)pBVar7->write);
                        pBVar22 = pBVar21;
                        if ((0x20 < uVar29) || ((0x100000600U >> (uVar29 & 0x3f) & 1) == 0)) break;
                        pBVar21 = (BinarySink *)((long)&pBVar21->write + 1);
                        pBVar22 = pBVar8;
                      } while (pBVar8 != pBVar21);
                    }
                    if (pBVar22 == pBVar8) {
                      pn[-2].error = (char *)pBVar22;
                      pHVar19->auth_type = AUTH_DIGEST;
                      goto LAB_00144b58;
                    }
                    _Var11 = get_separator((HttpProxyNegotiator *)s,',');
                    if (!_Var11) break;
                  }
                  pcVar16 = "parse error in Digest header";
                  goto LAB_00144b45;
                }
                pcVar16 = "authentication type \'%s\' not supported";
LAB_00144ae8:
                auth_error(pHVar19,pcVar16,pIVar25);
              }
            }
            else {
              pcVar16 = "parse error";
LAB_00144b45:
              auth_error(pHVar19,pcVar16);
            }
LAB_00144b58:
            HVar2 = pHVar19->auth_type;
            d = (HttpAuthDetails *)pn[-1].input;
            bVar33 = HVar2 < d->auth_type;
            bVar34 = HVar2 == d->auth_type;
            if (bVar34) {
              if (HVar2 == AUTH_DIGEST) {
                bVar33 = pHVar19->digest_hash < d->digest_hash;
                bVar34 = pHVar19->digest_hash == d->digest_hash;
                if (!bVar34) goto LAB_00144b71;
              }
            }
            else {
LAB_00144b71:
              if (bVar33 || bVar34) {
                http_auth_details_free(pHVar19);
                goto LAB_00144b8b;
              }
            }
            http_auth_details_free(d);
            pn[-1].input = (bufchain *)pHVar19;
          }
        }
      }
LAB_00144b8b:
    } while ((pn[-2].output[0].binarysink_[0].binarysink_)->binarysink_ != (BinarySink *)0x0);
    if (pn[-1].aborted != false) goto LAB_00145011;
    *(undefined4 *)&s->write = 0x264;
LAB_00144bc7:
    _Var11 = bufchain_try_consume(pn->input,*(size_t *)&pn[-1].done);
    if (!_Var11) {
      return;
    }
LAB_001450da:
    uVar24 = 0;
    if (*(int *)&pn[-1].ps - 200U < 100) {
      pn->done = true;
      goto LAB_0014518f;
    }
    if (*(int *)&pn[-1].ps != 0x197) {
      pcVar16 = dupprintf("HTTP response %s",
                          (long)*(int *)&pn[-2].done +
                          *(long *)pn[-2].output[0].binarysink_[0].writefmtv);
      goto LAB_00145189;
    }
    if (*(char *)((long)&pn[-1].ps + 4) == '\x01') {
      pn->reconnect = true;
    }
    pbVar4 = pn[-1].input;
    if (*(int *)&pbVar4->head == 0) {
      pcVar16 = dupstr((char *)(pbVar4[1].head)->next);
      pn->error = pcVar16;
      goto LAB_0014500a;
    }
    if (*(char *)&pn[-1].output[0].ch == '\x01') {
      *(undefined1 *)&pn[-1].output[0].ch = 0;
    }
    else if (*(char *)((long)&pbVar4->head + 4) == '\0') {
      if (pn->itr == (Interactor *)0x0) {
        pcVar16 = "HTTP proxy requested authentication which we do not have";
        goto LAB_00145164;
      }
      ppVar23 = proxy_new_prompts(pn->ps);
      pn[-1].output[0].binarysink_[0].binarysink_ = (BinarySink *)ppVar23;
      ppVar23->to_server = true;
      ppVar23->from_server = false;
      pcVar16 = dupstr("HTTP proxy authentication");
      ppVar23 = (prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_;
      ppVar23->name = pcVar16;
      if (*(long *)(*(long *)&pn[-2].aborted + 0x10) == 0) {
        *(int *)&pn[-1].itr = (int)ppVar23->n_prompts;
        pcVar16 = dupstr("Proxy username: ");
        add_prompt(ppVar23,pcVar16,true);
      }
      else {
        *(undefined4 *)&pn[-1].itr = 0xffffffff;
      }
      ppVar23 = (prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_;
      *(int *)((long)&pn[-1].itr + 4) = (int)ppVar23->n_prompts;
      pcVar16 = dupstr("Proxy password: ");
      add_prompt(ppVar23,pcVar16,false);
      goto LAB_00144371;
    }
  }
LAB_001445fe:
  pBVar7 = pn->output[0].binarysink_;
  BinarySink_put_fmt(pBVar7,"CONNECT %s HTTP/1.1\r\nHost: %s\r\n",
                     *(undefined8 *)pn[-1].output[0].binarysink_[0].write);
  iVar13 = *(int *)&(pn[-1].input)->head;
  if (iVar13 == 3) {
    pl_03.len = 0x1c;
    pl_03.ptr = "Proxy-Authorization: Digest ";
    BinarySink_put_datapl(pBVar7,pl_03);
    pl1.ptr = (pn[-2].itr)->parent;
    pl1.len = (size_t)(pn[-2].itr)->last_to_talk;
    _Var11 = ptrlen_eq_ptrlen(pl1,*(ptrlen *)((pn[-1].input)->queue_idempotent_callback + 8));
    if (!_Var11) {
      *(undefined4 *)&pn[-1].output[0].binarysink_[0].writefmtv = 0;
    }
    pVar35 = *(ptrlen *)(*(long *)&pn[-2].aborted + 8);
    password.ptr = (pn[-1].vt)->process_queue;
    password.len = (size_t)(pn[-1].vt)->free;
    pbVar4 = pn[-1].input;
    ppVar1 = (ptrlen *)(pbVar4->buffersize + 8);
    local_268 = ppVar1->ptr;
    uStack_260 = *(undefined8 *)(pbVar4->buffersize + 0x10);
    pVar36 = *ppVar1;
    local_298 = "CONNECT";
    uStack_290 = 7;
    p_Var5 = pn[-1].output[0].binarysink_[0].write;
    ppVar1 = (ptrlen *)(p_Var5 + 8);
    local_278 = ppVar1->ptr;
    uStack_270 = *(undefined8 *)(p_Var5 + 0x10);
    pVar9 = *ppVar1;
    local_2a8 = "auth";
    uStack_2a0 = 4;
    ppVar1 = (ptrlen *)(pbVar4->queue_idempotent_callback + 8);
    local_288 = ppVar1->ptr;
    uStack_280 = *(undefined8 *)(pbVar4->queue_idempotent_callback + 0x10);
    pVar10 = *ppVar1;
    if (*(char *)&pbVar4[1].tail == '\x01') {
      pIVar6 = pbVar4->ic;
      local_2b8 = *(undefined4 *)&pIVar6->ctx;
      uStack_2b4 = *(undefined4 *)((long)&pIVar6->ctx + 4);
      uStack_2b0 = *(undefined4 *)&pIVar6->queued;
      uStack_2ac = *(undefined4 *)&pIVar6->field_0x14;
    }
    else {
      local_2b8 = 0;
      uStack_2b4 = 0;
      uStack_2b0 = 0;
      uStack_2ac = 0;
    }
    nonce_count = *(int *)&pn[-1].output[0].binarysink_[0].writefmtv + 1;
    *(uint32_t *)&pn[-1].output[0].binarysink_[0].writefmtv = nonce_count;
    opaque.ptr._4_4_ = uStack_2b4;
    opaque.ptr._0_4_ = local_2b8;
    opaque.len._4_4_ = uStack_2ac;
    opaque.len._0_4_ = uStack_2b0;
    method.len = 7;
    method.ptr = "CONNECT";
    qop.len = 4;
    qop.ptr = "auth";
    http_digest_response
              (pBVar7,pVar35,password,pVar36,method,pVar9,qop,pVar10,opaque,nonce_count,
               *(HttpDigestHash *)&pbVar4->tail,*(_Bool *)((long)&pbVar4[1].tail + 1));
LAB_001448dd:
    pl_04.len = 2;
    pl_04.ptr = "\r\n";
    BinarySink_put_datapl(pBVar7,pl_04);
  }
  else if (iVar13 == 2) {
    pl_02.len = 0x1b;
    pl_02.ptr = "Proxy-Authorization: Basic ";
    BinarySink_put_datapl(pBVar7,pl_02);
    psVar18 = strbuf_new_nm();
    pBVar21 = psVar18->binarysink_;
    BinarySink_put_datapl(pBVar21,*(ptrlen *)(*(long *)&pn[-2].aborted + 8));
    BinarySink_put_byte(pBVar21,':');
    pl.ptr = (pn[-1].vt)->process_queue;
    pl.len = (size_t)(pn[-1].vt)->free;
    BinarySink_put_datapl(pBVar21,pl);
    uVar29 = psVar18->len;
    if (uVar29 != 0) {
      uVar26 = 0;
      uVar32 = uVar29;
      do {
        uVar28 = 3;
        if (uVar32 < 3) {
          uVar28 = uVar32;
        }
        base64_encode_atom(psVar18->u + uVar26,(int)uVar28,(char *)local_238);
        BinarySink_put_data(pBVar7,local_238,4);
        uVar26 = uVar26 + 3;
        uVar32 = uVar32 - 3;
      } while (uVar26 < uVar29);
    }
    strbuf_free(psVar18);
    smemclr(local_238,4);
    goto LAB_001448dd;
  }
  pl_05.len = 2;
  pl_05.ptr = "\r\n";
  BinarySink_put_datapl(pBVar7,pl_05);
  uVar24 = 0x1cf;
LAB_0014518f:
  *(undefined4 *)&s->write = uVar24;
  return;
}

Assistant:

static void proxy_http_process_queue(ProxyNegotiator *pn)
{
    HttpProxyNegotiator *s = container_of(pn, HttpProxyNegotiator, pn);

    crBegin(s->crLine);

    /*
     * Initialise our username and password strbufs from the Conf.
     */
    put_dataz(s->username, conf_get_str(pn->ps->conf, CONF_proxy_username));
    put_dataz(s->password, conf_get_str(pn->ps->conf, CONF_proxy_password));
    if (s->username->len || s->password->len)
        s->try_auth_from_conf = true;

    /*
     * Set up the host:port string we're trying to connect to, also
     * used as the URI string in HTTP Digest auth.
     */
    {
        char dest[512];
        sk_getaddr(pn->ps->remote_addr, dest, lenof(dest));
        put_fmt(s->uri, "%s:%d", dest, pn->ps->remote_port);
    }

    while (true) {
        /*
         * Standard prefix for the HTTP CONNECT request.
         */
        put_fmt(pn->output,
                "CONNECT %s HTTP/1.1\r\n"
                "Host: %s\r\n", s->uri->s, s->uri->s);

        /*
         * Add an auth header, if we're planning to this time round.
         */
        if (s->next_auth->auth_type == AUTH_BASIC) {
            put_datalit(pn->output, "Proxy-Authorization: Basic ");

            strbuf *base64_input = strbuf_new_nm();
            put_datapl(base64_input, ptrlen_from_strbuf(s->username));
            put_byte(base64_input, ':');
            put_datapl(base64_input, ptrlen_from_strbuf(s->password));

            char base64_output[4];
            for (size_t i = 0, e = base64_input->len; i < e; i += 3) {
                base64_encode_atom(base64_input->u + i,
                                   e-i > 3 ? 3 : e-i, base64_output);
                put_data(pn->output, base64_output, 4);
            }
            strbuf_free(base64_input);
            smemclr(base64_output, sizeof(base64_output));
            put_datalit(pn->output, "\r\n");
        } else if (s->next_auth->auth_type == AUTH_DIGEST) {
            put_datalit(pn->output, "Proxy-Authorization: Digest ");

            /* If we have a fresh nonce, reset the
             * nonce count. Otherwise, keep incrementing it. */
            if (!ptrlen_eq_ptrlen(ptrlen_from_strbuf(s->token),
                                  ptrlen_from_strbuf(s->next_auth->nonce)))
                s->nonce_count = 0;

            http_digest_response(BinarySink_UPCAST(pn->output),
                                 ptrlen_from_strbuf(s->username),
                                 ptrlen_from_strbuf(s->password),
                                 ptrlen_from_strbuf(s->next_auth->realm),
                                 PTRLEN_LITERAL("CONNECT"),
                                 ptrlen_from_strbuf(s->uri),
                                 PTRLEN_LITERAL("auth"),
                                 ptrlen_from_strbuf(s->next_auth->nonce),
                                 (s->next_auth->got_opaque ?
                                  ptrlen_from_strbuf(s->next_auth->opaque) :
                                  make_ptrlen(NULL, 0)),
                                 ++s->nonce_count, s->next_auth->digest_hash,
                                 s->next_auth->hash_username);
            put_datalit(pn->output, "\r\n");
        }

        /*
         * Blank line to terminate the HTTP request.
         */
        put_datalit(pn->output, "\r\n");
        crReturnV;

        s->content_length = 0;
        s->chunked_transfer = false;
        s->connection_close = false;

        /*
         * Read and parse the HTTP status line, and check if it's a 2xx
         * for success.
         */
        strbuf_clear(s->response);
        crMaybeWaitUntilV(read_line(pn->input, s->response, false));
        {
            int maj_ver, min_ver, n_scanned;
            n_scanned = sscanf(
                s->response->s, "HTTP/%d.%d %n%d",
                &maj_ver, &min_ver, &s->http_status_pos, &s->http_status);

            if (n_scanned < 3) {
                pn->error = dupstr("HTTP response was absent or malformed");
                crStopV;
            }

            if (maj_ver < 1 || (maj_ver == 1 && min_ver < 1)) {
                /* Before HTTP/1.1, connections close by default */
                s->connection_close = true;
            }
        }

        if (s->http_status == 407) {
            /*
             * If this is going to be an auth request, we expect to
             * see at least one Proxy-Authorization header offering us
             * auth options. Start by preloading s->next_auth with a
             * fallback error message, which will be used if nothing
             * better is available.
             */
            http_auth_details_free(s->next_auth);
            s->next_auth = http_auth_details_new();
            auth_error(s->next_auth, "no Proxy-Authorization header seen in "
                       "HTTP 407 Proxy Authentication Required response");
        }

        /*
         * Read the HTTP response header section.
         */
        do {
            strbuf_clear(s->header);
            crMaybeWaitUntilV(read_line(pn->input, s->header, true));
            s->header_pos = 0;

            if (!get_token(s)) {
                /* Possibly we ought to panic if we see an HTTP header
                 * we can't make any sense of at all? But whatever,
                 * ignore it and hope the next one makes more sense */
                continue;
            }

            /* Parse the header name */
            HttpHeader hdr = HDR_UNKNOWN;
            {
                #define CHECK_HEADER(id, string) \
                    if (!stricmp(s->token->s, string)) hdr = id;
                HTTP_HEADER_LIST(CHECK_HEADER);
                #undef CHECK_HEADER
            }

            if (!get_separator(s, ':'))
                continue;

            if (hdr == HDR_CONTENT_LENGTH) {
                if (!get_token(s))
                    continue;
                s->content_length = strtoumax(s->token->s, NULL, 10);
            } else if (hdr == HDR_TRANSFER_ENCODING) {
                /*
                 * The Transfer-Encoding header value should be a
                 * comma-separated list of keywords including
                 * "chunked", "deflate" and "gzip". We parse it in the
                 * most superficial way, by just looking for "chunked"
                 * and ignoring everything else.
                 *
                 * It's OK to do that because we're not actually
                 * _using_ the error document - we only have to skip
                 * over it to find the end of the HTTP response. So we
                 * don't care if it's gzipped or not.
                 */
                while (get_token(s)) {
                    if (!stricmp(s->token->s, "chunked"))
                        s->chunked_transfer = true;
                }
            } else if (hdr == HDR_CONNECTION ||
                       hdr == HDR_PROXY_CONNECTION) {
                if (!get_token(s))
                    continue;
                if (!stricmp(s->token->s, "close"))
                    s->connection_close = true;
                else if (!stricmp(s->token->s, "keep-alive"))
                    s->connection_close = false;
            } else if (hdr == HDR_PROXY_AUTHENTICATE) {
                HttpAuthDetails *auth = parse_http_auth_header(s);

                /*
                 * See if we prefer this set of auth details to the
                 * previous one we had (either from a previous auth
                 * header, or the fallback when no auth header is
                 * provided at all).
                 */
                bool change;

                if (auth->auth_type != s->next_auth->auth_type) {
                    /* Use the preference order implied by the enum */
                    change = auth->auth_type > s->next_auth->auth_type;
                } else if (auth->auth_type == AUTH_DIGEST &&
                           auth->digest_hash != s->next_auth->digest_hash) {
                    /* Choose based on the hash functions */
                    change = auth->digest_hash > s->next_auth->digest_hash;
                } else {
                    /*
                     * If in doubt, go with the later one of the
                     * headers.
                     *
                     * The main reason for this is so that an error in
                     * interpreting an auth header will supersede the
                     * default error we preload saying 'no header
                     * found', because that would be a particularly
                     * bad error to report if there _was_ one.
                     *
                     * But we're in a tie-breaking situation by now,
                     * so there's no other reason to choose - we might
                     * as well apply the same policy everywhere else
                     * too.
                     */
                    change = true;
                }

                if (change) {
                    http_auth_details_free(s->next_auth);
                    s->next_auth = auth;
                } else {
                    http_auth_details_free(auth);
                }
            }
        } while (s->header->len > 0);

        /* Read and ignore the entire response document */
        if (!s->chunked_transfer) {
            /* Simple approach: read exactly Content-Length bytes */
            crMaybeWaitUntilV(bufchain_try_consume(
                                  pn->input, s->content_length));
        } else {
            /* Chunked transfer: read a sequence of
             * <hex length>\r\n<data>\r\n chunks, terminating in one with
             * zero length */
            do {
                /*
                 * Expect a chunk length
                 */
                s->chunk_length = 0;
                while (true) {
                    char c;
                    crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                          pn->input, &c, 1));
                    if (c == '\r') {
                        continue;
                    } else if (c == '\n') {
                        break;
                    } else if ('0' <= c && c <= '9') {
                        s->chunk_length = s->chunk_length*16 + (c-'0');
                    } else if ('A' <= c && c <= 'F') {
                        s->chunk_length = s->chunk_length*16 + (c-'A'+10);
                    } else if ('a' <= c && c <= 'f') {
                        s->chunk_length = s->chunk_length*16 + (c-'a'+10);
                    } else {
                        pn->error = dupprintf(
                            "Received bad character 0x%02X in chunk length "
                            "during HTTP chunked transfer encoding",
                            (unsigned)(unsigned char)c);
                        crStopV;
                    }
                }

                /*
                 * Expect that many bytes of chunked data
                 */
                crMaybeWaitUntilV(bufchain_try_consume(
                                      pn->input, s->chunk_length));

                /* Now expect \r\n */
                {
                    char buf[2];
                    crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                          pn->input, buf, 2));
                    if (memcmp(buf, "\r\n", 2)) {
                        pn->error = dupprintf(
                            "Missing CRLF after chunk "
                            "during HTTP chunked transfer encoding");
                        crStopV;
                    }
                }
            } while (s->chunk_length);
        }

        if (200 <= s->http_status && s->http_status < 300) {
            /* Any 2xx HTTP response means we're done */
            goto authenticated;
        } else if (s->http_status == 407) {
            /* 407 is Proxy Authentication Required, which we may be
             * able to do something about. */
            if (s->connection_close) {
                /* If we got 407 + connection closed, reconnect before
                 * sending our next request. */
                pn->reconnect = true;
            }

            /* If the best we can do is report some kind of error from
             * a Proxy-Auth header (or an error saying there wasn't
             * one at all), and no successful parsing of an auth
             * header superseded that, then just throw that error and
             * die. */
            if (s->next_auth->auth_type == AUTH_ERROR) {
                pn->error = dupstr(s->next_auth->error->s);
                crStopV;
            }

            /* If we have auth details from the Conf and haven't tried
             * them yet, that's our first step. */
            if (s->try_auth_from_conf) {
                s->try_auth_from_conf = false;
                continue;
            }

            /* If the server sent us stale="true" in a Digest auth
             * header, that means we _don't_ need to request a new
             * password yet; just try again with the existing details
             * and the fresh nonce it sent us. */
            if (s->next_auth->digest_nonce_was_stale)
                continue;

            /* Either we never had a password in the first place, or
             * the one we already presented was rejected. We can only
             * proceed from here if we have a way to ask the user
             * questions. */
            if (!pn->itr) {
                pn->error = dupprintf("HTTP proxy requested authentication "
                                      "which we do not have");
                crStopV;
            }

            /*
             * Send some prompts to the user. We'll assume the
             * password is always required (since it's just been
             * rejected, even if we did send one before), and we'll
             * prompt for the username only if we don't have one from
             * the Conf.
             */
            s->prompts = proxy_new_prompts(pn->ps);
            s->prompts->to_server = true;
            s->prompts->from_server = false;
            s->prompts->name = dupstr("HTTP proxy authentication");
            if (!s->username->len) {
                s->username_prompt_index = s->prompts->n_prompts;
                add_prompt(s->prompts, dupstr("Proxy username: "), true);
            } else {
                s->username_prompt_index = -1;
            }

            s->password_prompt_index = s->prompts->n_prompts;
            add_prompt(s->prompts, dupstr("Proxy password: "), false);

            while (true) {
                SeatPromptResult spr = seat_get_userpass_input(
                    interactor_announce(pn->itr), s->prompts);
                if (spr.kind == SPRK_OK) {
                    break;
                } else if (spr_is_abort(spr)) {
                    proxy_spr_abort(pn, spr);
                    crStopV;
                }
                crReturnV;
            }

            if (s->username_prompt_index != -1) {
                strbuf_clear(s->username);
                put_dataz(s->username,
                          prompt_get_result_ref(
                              s->prompts->prompts[s->username_prompt_index]));
            }

            strbuf_clear(s->password);
            put_dataz(s->password,
                      prompt_get_result_ref(
                          s->prompts->prompts[s->password_prompt_index]));

            free_prompts(s->prompts);
            s->prompts = NULL;
        } else {
            /* Any other HTTP response is treated as permanent failure */
            pn->error = dupprintf("HTTP response %s",
                                  s->response->s + s->http_status_pos);
            crStopV;
        }
    }

  authenticated:
    /*
     * Success! Hand over to the main connection.
     */
    pn->done = true;

    crFinishV;
}